

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

Node * makeSequence(Node *e)

{
  Node *node;
  Node *e_local;
  
  e_local = e;
  if (e->type != 0xb) {
    e_local = _newNode(0xb,0x28);
    if (e == (Node *)0x0) {
      __assert_fail("e",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                    ,0xcd,"Node *makeSequence(Node *)");
    }
    if ((e->rule).next != (Node *)0x0) {
      __assert_fail("!e->any.next",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                    ,0xce,"Node *makeSequence(Node *)");
    }
    (e_local->rule).variables = e;
    (e_local->name).rule = e;
  }
  return e_local;
}

Assistant:

Node *makeSequence(Node *e)
{
  if (Sequence != e->type)
    {
      Node *node= newNode(Sequence);
      assert(e);
      assert(!e->any.next);
      node->sequence.first=
	node->sequence.last= e;
      return node;
    }
  return e;
}